

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  long lVar1;
  TestInfo *pTVar2;
  InternalRunDeathTestFlag *pIVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  TestRole TVar7;
  UnitTestImpl *pUVar8;
  int *piVar9;
  void *__addr;
  undefined8 extraout_RAX;
  long lVar10;
  size_t __len;
  long in_FS_OFFSET;
  int death_test_index;
  allocator<char> local_301;
  string local_300;
  ExecDeathTestArgs args_2;
  Arguments args;
  string internal_flag;
  string filter_flag;
  int pipe_fd [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  bool result;
  int dummy;
  sigaction ignore_sigprof_action;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pUVar8 = GetUnitTestImpl();
  pTVar2 = pUVar8->current_test_info_;
  pIVar3 = (pUVar8->internal_run_death_test_flag_).ptr_;
  death_test_index = (pTVar2->result_).death_test_count_;
  if (pIVar3 == (InternalRunDeathTestFlag *)0x0) {
    iVar4 = pipe(pipe_fd);
    if (iVar4 == -1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,"CHECK failed: File ",(allocator<char> *)&local_238);
      std::operator+(&local_1b8,&local_1d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                     &local_1b8,", line ");
      local_218._M_dataplus._M_p._0_4_ = 0x543;
      StreamableToString<int>(&local_1f8,(int *)&local_218);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                     &local_1f8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ignore_sigprof_action,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                     ": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ignore_sigprof_action,"pipe(pipe_fd) != -1");
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00156e8b;
      DeathTestAbort((string *)&args_1);
    }
    else {
      iVar4 = fcntl(pipe_fd[1],2,0);
      if (iVar4 != -1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d8,"--",(allocator<char> *)&local_1f8);
        std::operator+(&local_1b8,&local_1d8,"gtest_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       &local_1b8,"filter");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       "=");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ignore_sigprof_action,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                       (pTVar2->test_case_name_)._M_dataplus._M_p);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ignore_sigprof_action,".");
        std::operator+(&filter_flag,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1,
                       (pTVar2->name_)._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&args_1);
        std::__cxx11::string::~string((string *)&ignore_sigprof_action);
        std::__cxx11::string::~string((string *)&dummy);
        std::__cxx11::string::~string((string *)&result);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"--",&local_301);
        std::operator+(&local_238,&local_258,"gtest_");
        std::operator+(&local_218,&local_238,"internal_run_death_test");
        std::operator+(&local_1f8,&local_218,"=");
        std::operator+(&local_1d8,&local_1f8,this->file_);
        std::operator+(&local_1b8,&local_1d8,"|");
        StreamableToString<int>((string *)&args,&this->line_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       &local_1b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       "|");
        StreamableToString<int>((string *)&args_2,&death_test_index);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ignore_sigprof_action,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_2)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ignore_sigprof_action,"|");
        StreamableToString<int>(&local_300,pipe_fd + 1);
        std::operator+(&internal_flag,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1,
                       &local_300);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&args_1);
        std::__cxx11::string::~string((string *)&ignore_sigprof_action);
        std::__cxx11::string::~string((string *)&args_2);
        std::__cxx11::string::~string((string *)&dummy);
        std::__cxx11::string::~string((string *)&result);
        std::__cxx11::string::~string((string *)&args);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_258);
        Arguments::Arguments(&args);
        GetInjectableArgvs_abi_cxx11_();
        Arguments::AddArguments<std::__cxx11::string>(&args,&args_1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&args_1);
        Arguments::AddArgument(&args,filter_flag._M_dataplus._M_p);
        Arguments::AddArgument(&args,internal_flag._M_dataplus._M_p);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&args_1,"",(allocator<char> *)&ignore_sigprof_action);
        DeathTest::set_last_death_test_message((string *)&args_1);
        std::__cxx11::string::~string((string *)&args_1);
        CaptureStderr();
        FlushInfoLog();
        args_2.argv = args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
        args_2.close_fd = pipe_fd[0];
        memset((sigaction *)&ignore_sigprof_action,0,0x98);
        sigemptyset((sigset_t *)&ignore_sigprof_action.sa_mask);
        ignore_sigprof_action.__sigaction_handler =
             (anon_union_8_2_5ad2d23e_for___sigaction_handler)0x1;
        do {
          iVar4 = sigaction(0x1b,(sigaction *)&ignore_sigprof_action,(sigaction *)&args_1);
          if (iVar4 != -1) goto LAB_00156128;
          piVar9 = __errno_location();
        } while (*piVar9 == 4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_238,"CHECK failed: File ",&local_301);
        std::operator+(&local_218,&local_238,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_1f8,&local_218,", line ");
        local_300._M_dataplus._M_p._0_4_ = 0x501;
        StreamableToString<int>(&local_258,(int *)&local_300);
        std::operator+(&local_1d8,&local_1f8,&local_258);
        std::operator+(&local_1b8,&local_1d8,": ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       &local_1b8,
                       "sigaction( SIGPROF, &ignore_sigprof_action, &saved_sigprof_action)");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       " != -1");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          DeathTestAbort((string *)&dummy);
LAB_00156128:
          if (FLAGS_gtest_death_test_use_fork != '\0') {
            iVar4 = fork();
            if (iVar4 == 0) goto LAB_00156738;
            goto LAB_001561d4;
          }
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0')
          goto LAB_00156759;
          goto LAB_00156153;
        }
        goto LAB_00156e8b;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"CHECK failed: File ",(allocator<char> *)&local_238);
    std::operator+(&local_1b8,&local_1d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_1b8,", line ");
    local_218._M_dataplus._M_p._0_4_ = 0x546;
    StreamableToString<int>(&local_1f8,(int *)&local_218);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_1f8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,": ")
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action,"fcntl(pipe_fd[1], F_SETFD, 0) != -1");
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00156e8b;
    DeathTestAbort((string *)&args_1);
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,"CHECK failed: File ",(allocator<char> *)&local_300);
      std::operator+(&local_1f8,&local_218,
                     "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_1d8,&local_1f8,", line ");
      local_258._M_dataplus._M_p._0_4_ = 0x52e;
      StreamableToString<int>(&local_238,(int *)&local_258);
      std::operator+(&local_1b8,&local_1d8,&local_238);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                     &local_1b8,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                     "child_pid != -1");
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00156e8b;
      DeathTestAbort((string *)&dummy);
LAB_00156738:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00156e8b;
      ExecDeathTestChildMain(&args_2);
LAB_00156759:
      iVar4 = __cxa_guard_acquire();
      if (iVar4 != 0) {
        StackLowerThanAddress(&dummy,&result);
        ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down = result;
        __cxa_guard_release();
      }
LAB_00156153:
      uVar5 = getpagesize();
      __len = (size_t)(int)uVar5;
      __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
      if (__addr == (void *)0xffffffffffffffff) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_218,"CHECK failed: File ",(allocator<char> *)&local_300);
        std::operator+(&local_1f8,&local_218,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_1d8,&local_1f8,", line ");
        local_258._M_dataplus._M_p._0_4_ = 0x50d;
        StreamableToString<int>(&local_238,(int *)&local_258);
        std::operator+(&local_1b8,&local_1d8,&local_238);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       &local_1b8,": ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       "stack != MAP_FAILED");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          DeathTestAbort((string *)&dummy);
LAB_00156884:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_218,"CHECK failed: File ",(allocator<char> *)&local_300);
          std::operator+(&local_1f8,&local_218,
                         "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                        );
          std::operator+(&local_1d8,&local_1f8,", line ");
          local_258._M_dataplus._M_p._0_4_ = 0x51a;
          StreamableToString<int>(&local_238,(int *)&local_258);
          std::operator+(&local_1b8,&local_1d8,&local_238);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &result,&local_1b8,": ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &result,
                         "stack_size > kMaxStackAlignment && reinterpret_cast<intptr_t>(stack_top) % kMaxStackAlignment == 0"
                        );
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            DeathTestAbort((string *)&dummy);
LAB_00156969:
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_218,"CHECK failed: File ",(allocator<char> *)&local_300);
            std::operator+(&local_1f8,&local_218,
                           "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                          );
            std::operator+(&local_1d8,&local_1f8,", line ");
            local_258._M_dataplus._M_p._0_4_ = 0x51e;
            StreamableToString<int>(&local_238,(int *)&local_258);
            std::operator+(&local_1b8,&local_1d8,&local_238);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &result,&local_1b8,": ");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &dummy,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&result,"munmap(stack, stack_size) != -1");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              DeathTestAbort((string *)&dummy);
              std::__cxx11::string::~string((string *)&dummy);
              std::__cxx11::string::~string((string *)&result);
              std::__cxx11::string::~string((string *)&local_1b8);
              std::__cxx11::string::~string((string *)&local_238);
              std::__cxx11::string::~string((string *)&local_1d8);
              std::__cxx11::string::~string((string *)&local_1f8);
              std::__cxx11::string::~string((string *)&local_218);
              Arguments::~Arguments(&args);
              std::__cxx11::string::~string((string *)&internal_flag);
              std::__cxx11::string::~string((string *)&filter_flag);
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                _Unwind_Resume(extraout_RAX);
              }
            }
          }
        }
        goto LAB_00156e8b;
      }
      lVar10 = 0;
      if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
        lVar10 = __len - 0x40;
      }
      if ((uVar5 < 0x41) || (((ulong)(lVar10 + (long)__addr) & 0x3f) != 0)) goto LAB_00156884;
      iVar4 = clone(ExecDeathTestChildMain,(void *)(lVar10 + (long)__addr),0x11,&args_2);
      iVar6 = munmap(__addr,__len);
      if (iVar6 == -1) goto LAB_00156969;
LAB_001561d4:
      do {
        iVar6 = sigaction(0x1b,(sigaction *)&args_1,(sigaction *)0x0);
        if (iVar6 != -1) goto LAB_001562fe;
        piVar9 = __errno_location();
      } while (*piVar9 == 4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"CHECK failed: File ",&local_301);
      std::operator+(&local_218,&local_238,
                     "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_1f8,&local_218,", line ");
      local_300._M_dataplus._M_p._0_4_ = 0x52b;
      StreamableToString<int>(&local_258,(int *)&local_300);
      std::operator+(&local_1d8,&local_1f8,&local_258);
      std::operator+(&local_1b8,&local_1d8,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                     &local_1b8,"sigaction(SIGPROF, &saved_sigprof_action, NULL)");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                     " != -1");
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00156e8b;
      DeathTestAbort((string *)&dummy);
LAB_001562fe:
    } while (iVar4 == -1);
    do {
      iVar6 = close(pipe_fd[1]);
      if (iVar6 != -1) goto LAB_0015642a;
      piVar9 = __errno_location();
    } while (*piVar9 == 4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"CHECK failed: File ",(allocator<char> *)&local_258);
    std::operator+(&local_1d8,&local_1f8,
                   "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_1b8,&local_1d8,", line ");
    local_238._M_dataplus._M_p._0_4_ = 0x55d;
    StreamableToString<int>(&local_218,(int *)&local_238);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_1b8,&local_218);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,": "
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                   "close(pipe_fd[1])");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action," != -1");
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00156e8b;
    DeathTestAbort((string *)&args_1);
LAB_0015642a:
    *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = iVar4;
    (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = pipe_fd[0];
    (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
    Arguments::~Arguments(&args);
    std::__cxx11::string::~string((string *)&internal_flag);
    std::__cxx11::string::~string((string *)&filter_flag);
    TVar7 = OVERSEE_TEST;
  }
  else {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar3->write_fd_;
    TVar7 = EXECUTE_TEST;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return TVar7;
  }
LAB_00156e8b:
  __stack_chk_fail();
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != NULL) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kFilterFlag + "="
      + info->test_case_name() + "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}